

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O0

UserObject * __thiscall
camp::Class::construct(UserObject *__return_storage_ptr__,Class *this,Args *args)

{
  bool bVar1;
  __shared_ptr_access<camp::Constructor,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar2;
  ulong uVar3;
  Constructor *constructor;
  const_iterator it;
  const_iterator end;
  Args *args_local;
  Class *this_local;
  
  it = std::
       vector<std::shared_ptr<camp::Constructor>,_std::allocator<std::shared_ptr<camp::Constructor>_>_>
       ::end(&this->m_constructors);
  constructor = (Constructor *)
                std::
                vector<std::shared_ptr<camp::Constructor>,_std::allocator<std::shared_ptr<camp::Constructor>_>_>
                ::begin(&this->m_constructors);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::shared_ptr<camp::Constructor>_*,_std::vector<std::shared_ptr<camp::Constructor>,_std::allocator<std::shared_ptr<camp::Constructor>_>_>_>
                        *)&constructor,&it);
    if (!bVar1) {
      UserObject::UserObject(__return_storage_ptr__,(UserObject *)UserObject::nothing);
      return __return_storage_ptr__;
    }
    this_00 = (__shared_ptr_access<camp::Constructor,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<const_std::shared_ptr<camp::Constructor>_*,_std::vector<std::shared_ptr<camp::Constructor>,_std::allocator<std::shared_ptr<camp::Constructor>_>_>_>
              ::operator*((__normal_iterator<const_std::shared_ptr<camp::Constructor>_*,_std::vector<std::shared_ptr<camp::Constructor>,_std::allocator<std::shared_ptr<camp::Constructor>_>_>_>
                           *)&constructor);
    peVar2 = std::__shared_ptr_access<camp::Constructor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*(this_00);
    uVar3 = (**(code **)(*(long *)peVar2 + 0x10))(peVar2,args);
    if ((uVar3 & 1) != 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<camp::Constructor>_*,_std::vector<std::shared_ptr<camp::Constructor>,_std::allocator<std::shared_ptr<camp::Constructor>_>_>_>
    ::operator++((__normal_iterator<const_std::shared_ptr<camp::Constructor>_*,_std::vector<std::shared_ptr<camp::Constructor>,_std::allocator<std::shared_ptr<camp::Constructor>_>_>_>
                  *)&constructor);
  }
  (**(code **)(*(long *)peVar2 + 0x18))(__return_storage_ptr__,peVar2,args);
  return __return_storage_ptr__;
}

Assistant:

UserObject Class::construct(const Args& args) const
{
    // Search an arguments match among the list of available constructors
    ConstructorList::const_iterator end = m_constructors.end();
    for (ConstructorList::const_iterator it = m_constructors.begin();
         it != end;
         ++it)
    {
        Constructor& constructor = **it;
        if (constructor.matches(args))
        {
            // Match found: use the constructor to create the new instance
            return constructor.create(args);
        }
    }

    // No match found
    return UserObject::nothing;
}